

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack16to8_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  int iVar4;
  uint _h;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  int *piVar19;
  uint uVar20;
  undefined1 (*pauVar21) [64];
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 (*pauVar25) [32];
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 (*pauVar29) [64];
  ulong uVar30;
  undefined1 (*pauVar31) [32];
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  undefined1 (*pauVar36) [64];
  int iVar37;
  undefined1 (*pauVar38) [64];
  int iVar39;
  int iVar40;
  long lVar41;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  int nn;
  float zeros [16];
  Mat local_e8;
  ulong local_a0;
  int local_98;
  int local_94;
  void *local_90;
  Mat *local_88;
  ulong local_80;
  undefined1 local_78 [64];
  
  uVar3 = bottom_im2col->w;
  lVar23 = (long)(int)uVar3;
  iVar4 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar30 = (ulong)_h;
  local_a0 = (ulong)top_blob->c;
  local_90 = _bias->data;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  if (lVar23 < 8) {
    iVar37 = iVar4;
    uVar20 = uVar3;
    if (3 < (int)uVar3) {
      iVar37 = iVar4 * 4;
      uVar20 = (uVar3 & 3) + 1;
    }
  }
  else {
    iVar37 = iVar4 * 8;
    uVar20 = (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0);
  }
  local_88 = top_blob;
  Mat::create(&local_e8,iVar37,_h,uVar20,0x40,0x10,opt->workspace_allocator);
  uVar20 = uVar3 + 7;
  if (-1 < (int)uVar3) {
    uVar20 = uVar3;
  }
  uVar20 = (int)uVar20 >> 3;
  if (7 < (int)uVar3) {
    lVar24 = 0x100;
    uVar27 = 0;
    do {
      if (0 < (int)_h) {
        pauVar29 = (undefined1 (*) [64])
                   (local_e8.cstep * uVar27 *
                    CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                   (long)local_e8.data);
        uVar33 = 0;
        do {
          if (0 < iVar4) {
            pauVar36 = (undefined1 (*) [64])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar33 + lVar24);
            iVar37 = iVar4;
            do {
              auVar50 = vunpcklps_avx512f(pauVar36[-4],pauVar36[-3]);
              auVar51 = vunpckhps_avx512f(pauVar36[-4],pauVar36[-3]);
              auVar52 = vunpcklps_avx512f(pauVar36[-2],pauVar36[-1]);
              auVar53 = vunpckhps_avx512f(pauVar36[-2],pauVar36[-1]);
              auVar54 = vunpcklps_avx512f(*pauVar36,pauVar36[1]);
              auVar55 = vunpckhps_avx512f(*pauVar36,pauVar36[1]);
              auVar56 = vunpcklps_avx512f(pauVar36[2],pauVar36[3]);
              auVar57 = vunpckhps_avx512f(pauVar36[2],pauVar36[3]);
              auVar58 = vunpcklpd_avx512f(auVar50,auVar52);
              auVar50 = vunpckhpd_avx512f(auVar50,auVar52);
              auVar52 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vunpcklpd_avx512f(auVar54,auVar56);
              auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
              auVar56 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vshuff64x2_avx512f(auVar58,auVar53,0x88);
              auVar59 = vshuff64x2_avx512f(auVar50,auVar54,0x88);
              auVar60 = vshuff64x2_avx512f(auVar52,auVar56,0x88);
              auVar61 = vshuff64x2_avx512f(auVar51,auVar55,0x88);
              auVar53 = vshuff64x2_avx512f(auVar58,auVar53,0xdd);
              auVar50 = vshuff64x2_avx512f(auVar50,auVar54,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar52,auVar56,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar51,auVar55,0xdd);
              auVar54 = vshuff64x2_avx512f(auVar57,auVar59,0x88);
              auVar55 = vshuff64x2_avx512f(auVar60,auVar61,0x88);
              auVar56 = vshuff64x2_avx512f(auVar53,auVar50,0x88);
              auVar58 = vshuff64x2_avx512f(auVar52,auVar51,0x88);
              auVar57 = vshuff64x2_avx512f(auVar57,auVar59,0xdd);
              auVar59 = vshuff64x2_avx512f(auVar60,auVar61,0xdd);
              auVar50 = vshuff64x2_avx512f(auVar53,auVar50,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar52,auVar51,0xdd);
              *pauVar29 = auVar54;
              pauVar29[1] = auVar55;
              pauVar29[2] = auVar56;
              pauVar29[3] = auVar58;
              pauVar29[4] = auVar57;
              pauVar29[5] = auVar59;
              pauVar29[6] = auVar50;
              pauVar29[7] = auVar51;
              pauVar29 = pauVar29 + 8;
              pauVar36 = (undefined1 (*) [64])(*pauVar36 + (ulong)(uVar3 << 4) * 4);
              iVar37 = iVar37 + -1;
            } while (iVar37 != 0);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar30);
      }
      uVar27 = uVar27 + 1;
      lVar24 = lVar24 + 0x200;
    } while (uVar27 != uVar20);
  }
  iVar37 = uVar20 * 8;
  uVar20 = uVar3 + uVar20 * -8;
  uVar26 = (int)uVar20 >> 2;
  if (0 < (int)uVar26) {
    lVar24 = (long)iVar37 * 0x40 + 0xc0;
    uVar27 = 0;
    do {
      if (0 < (int)_h) {
        uVar32 = iVar37 + (int)uVar27 * 4;
        uVar34 = iVar37 + (int)uVar27 * 4 + 7;
        if (-1 < (int)uVar32) {
          uVar34 = uVar32;
        }
        pauVar29 = (undefined1 (*) [64])
                   ((long)(((int)uVar34 >> 3) + ((int)(uVar32 - (uVar34 & 0xfffffff8)) >> 2)) *
                    local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                   + (long)local_e8.data);
        uVar33 = 0;
        do {
          if (0 < iVar4) {
            pauVar36 = (undefined1 (*) [64])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar33 + lVar24);
            iVar40 = iVar4;
            do {
              auVar50 = vunpcklps_avx512f(pauVar36[-3],pauVar36[-2]);
              auVar51 = vunpckhps_avx512f(pauVar36[-3],pauVar36[-2]);
              auVar52 = vunpcklps_avx512f(pauVar36[-1],*pauVar36);
              auVar53 = vunpckhps_avx512f(pauVar36[-1],*pauVar36);
              auVar54 = vunpcklpd_avx512f(auVar50,auVar52);
              auVar50 = vunpckhpd_avx512f(auVar50,auVar52);
              auVar52 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vshuff64x2_avx512f(auVar54,auVar50,0x88);
              auVar55 = vshuff64x2_avx512f(auVar52,auVar51,0x88);
              auVar50 = vshuff64x2_avx512f(auVar54,auVar50,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar52,auVar51,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar53,auVar55,0x88);
              auVar54 = vshuff64x2_avx512f(auVar50,auVar51,0x88);
              auVar53 = vshuff64x2_avx512f(auVar53,auVar55,0xdd);
              auVar50 = vshuff64x2_avx512f(auVar50,auVar51,0xdd);
              *pauVar29 = auVar52;
              pauVar29[1] = auVar54;
              pauVar29[2] = auVar53;
              pauVar29[3] = auVar50;
              pauVar29 = pauVar29 + 4;
              pauVar36 = (undefined1 (*) [64])(*pauVar36 + (long)(int)(uVar3 << 4) * 4);
              iVar40 = iVar40 + -1;
            } while (iVar40 != 0);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar30);
      }
      uVar27 = uVar27 + 1;
      lVar24 = lVar24 + 0x100;
    } while (uVar27 != uVar26);
  }
  iVar37 = (uVar20 & 0xfffffffc) + iVar37;
  if (iVar37 < (int)uVar3) {
    lVar24 = (long)iVar37;
    lVar22 = lVar24 << 6;
    do {
      if (0 < (int)_h) {
        uVar20 = (uint)lVar24;
        uVar34 = uVar20 + 7;
        uVar26 = uVar20 + 3;
        if (-1 < (int)uVar20) {
          uVar34 = uVar20;
          uVar26 = uVar20;
        }
        iVar40 = uVar20 - (uVar34 & 0xfffffff8);
        iVar37 = (uVar20 - (uVar34 & 0xfffffff8)) + 3;
        if (-1 < iVar40) {
          iVar37 = iVar40;
        }
        pauVar29 = (undefined1 (*) [64])
                   ((long)(int)((iVar37 >> 2) +
                               ((int)uVar34 >> 3) + (uVar20 - (uVar26 & 0xfffffffc))) *
                    local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                   + (long)local_e8.data);
        uVar27 = 0;
        do {
          if (0 < iVar4) {
            pauVar36 = (undefined1 (*) [64])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar27 + lVar22);
            iVar37 = iVar4;
            do {
              *pauVar29 = *pauVar36;
              pauVar29 = pauVar29 + 1;
              pauVar36 = (undefined1 (*) [64])(*pauVar36 + (long)(int)(uVar3 << 4) * 4);
              iVar37 = iVar37 + -1;
            } while (iVar37 != 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar30);
      }
      lVar24 = lVar24 + 1;
      lVar22 = lVar22 + 0x40;
    } while (lVar24 < lVar23);
  }
  uVar20 = (int)local_a0 >> 1;
  if (0 < (int)uVar20) {
    iVar37 = _h * iVar4 * 0x10;
    local_94 = _h * iVar4 * 0x10;
    local_98 = _h * iVar4 * 0x10;
    local_80 = (ulong)uVar20;
    uVar30 = 0;
    do {
      pauVar36 = (undefined1 (*) [64])
                 (uVar30 * 2 * local_88->cstep * local_88->elemsize + (long)local_88->data);
      pauVar38 = (undefined1 (*) [64])
                 ((uVar30 * 2 + 1) * local_88->cstep * local_88->elemsize + (long)local_88->data);
      pauVar29 = (undefined1 (*) [64])(uVar30 * 0x40 + (long)local_90);
      if (local_90 == (void *)0x0) {
        pauVar29 = &local_78;
      }
      local_78 = ZEXT864(0) << 0x40;
      if ((int)uVar3 < 8) {
        uVar27 = 0;
      }
      else {
        lVar24 = 0;
        uVar33 = 0;
        do {
          auVar50 = *pauVar29;
          auVar51 = auVar50;
          auVar52 = auVar50;
          auVar53 = auVar50;
          auVar54 = auVar50;
          auVar55 = auVar50;
          auVar56 = auVar50;
          auVar57 = auVar50;
          if (0 < (int)(_h * iVar4 * 0x10)) {
            lVar41 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) * lVar24;
            lVar22 = 0;
            iVar40 = iVar37;
            do {
              auVar58 = *(undefined1 (*) [64])
                         ((long)kernel->data +
                         lVar22 * 2 + kernel->cstep * uVar30 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41);
              auVar59._4_4_ = uVar1;
              auVar59._0_4_ = uVar1;
              auVar59._8_4_ = uVar1;
              auVar59._12_4_ = uVar1;
              auVar59._16_4_ = uVar1;
              auVar59._20_4_ = uVar1;
              auVar59._24_4_ = uVar1;
              auVar59._28_4_ = uVar1;
              auVar59._32_4_ = uVar1;
              auVar59._36_4_ = uVar1;
              auVar59._40_4_ = uVar1;
              auVar59._44_4_ = uVar1;
              auVar59._48_4_ = uVar1;
              auVar59._52_4_ = uVar1;
              auVar59._56_4_ = uVar1;
              auVar59._60_4_ = uVar1;
              auVar50 = vfmadd231ps_avx512f(auVar50,auVar58,auVar59);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 4);
              auVar60._4_4_ = uVar1;
              auVar60._0_4_ = uVar1;
              auVar60._8_4_ = uVar1;
              auVar60._12_4_ = uVar1;
              auVar60._16_4_ = uVar1;
              auVar60._20_4_ = uVar1;
              auVar60._24_4_ = uVar1;
              auVar60._28_4_ = uVar1;
              auVar60._32_4_ = uVar1;
              auVar60._36_4_ = uVar1;
              auVar60._40_4_ = uVar1;
              auVar60._44_4_ = uVar1;
              auVar60._48_4_ = uVar1;
              auVar60._52_4_ = uVar1;
              auVar60._56_4_ = uVar1;
              auVar60._60_4_ = uVar1;
              auVar57 = vfmadd231ps_avx512f(auVar57,auVar58,auVar60);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 8);
              auVar61._4_4_ = uVar1;
              auVar61._0_4_ = uVar1;
              auVar61._8_4_ = uVar1;
              auVar61._12_4_ = uVar1;
              auVar61._16_4_ = uVar1;
              auVar61._20_4_ = uVar1;
              auVar61._24_4_ = uVar1;
              auVar61._28_4_ = uVar1;
              auVar61._32_4_ = uVar1;
              auVar61._36_4_ = uVar1;
              auVar61._40_4_ = uVar1;
              auVar61._44_4_ = uVar1;
              auVar61._48_4_ = uVar1;
              auVar61._52_4_ = uVar1;
              auVar61._56_4_ = uVar1;
              auVar61._60_4_ = uVar1;
              auVar56 = vfmadd231ps_avx512f(auVar56,auVar58,auVar61);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 0xc);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar55 = vfmadd231ps_avx512f(auVar55,auVar58,auVar14);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 0x10);
              auVar15._4_4_ = uVar1;
              auVar15._0_4_ = uVar1;
              auVar15._8_4_ = uVar1;
              auVar15._12_4_ = uVar1;
              auVar15._16_4_ = uVar1;
              auVar15._20_4_ = uVar1;
              auVar15._24_4_ = uVar1;
              auVar15._28_4_ = uVar1;
              auVar15._32_4_ = uVar1;
              auVar15._36_4_ = uVar1;
              auVar15._40_4_ = uVar1;
              auVar15._44_4_ = uVar1;
              auVar15._48_4_ = uVar1;
              auVar15._52_4_ = uVar1;
              auVar15._56_4_ = uVar1;
              auVar15._60_4_ = uVar1;
              auVar54 = vfmadd231ps_avx512f(auVar54,auVar58,auVar15);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 0x14);
              auVar16._4_4_ = uVar1;
              auVar16._0_4_ = uVar1;
              auVar16._8_4_ = uVar1;
              auVar16._12_4_ = uVar1;
              auVar16._16_4_ = uVar1;
              auVar16._20_4_ = uVar1;
              auVar16._24_4_ = uVar1;
              auVar16._28_4_ = uVar1;
              auVar16._32_4_ = uVar1;
              auVar16._36_4_ = uVar1;
              auVar16._40_4_ = uVar1;
              auVar16._44_4_ = uVar1;
              auVar16._48_4_ = uVar1;
              auVar16._52_4_ = uVar1;
              auVar16._56_4_ = uVar1;
              auVar16._60_4_ = uVar1;
              auVar53 = vfmadd231ps_avx512f(auVar53,auVar58,auVar16);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 0x18);
              auVar17._4_4_ = uVar1;
              auVar17._0_4_ = uVar1;
              auVar17._8_4_ = uVar1;
              auVar17._12_4_ = uVar1;
              auVar17._16_4_ = uVar1;
              auVar17._20_4_ = uVar1;
              auVar17._24_4_ = uVar1;
              auVar17._28_4_ = uVar1;
              auVar17._32_4_ = uVar1;
              auVar17._36_4_ = uVar1;
              auVar17._40_4_ = uVar1;
              auVar17._44_4_ = uVar1;
              auVar17._48_4_ = uVar1;
              auVar17._52_4_ = uVar1;
              auVar17._56_4_ = uVar1;
              auVar17._60_4_ = uVar1;
              auVar52 = vfmadd231ps_avx512f(auVar52,auVar58,auVar17);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar41 + 0x1c);
              auVar18._4_4_ = uVar1;
              auVar18._0_4_ = uVar1;
              auVar18._8_4_ = uVar1;
              auVar18._12_4_ = uVar1;
              auVar18._16_4_ = uVar1;
              auVar18._20_4_ = uVar1;
              auVar18._24_4_ = uVar1;
              auVar18._28_4_ = uVar1;
              auVar18._32_4_ = uVar1;
              auVar18._36_4_ = uVar1;
              auVar18._40_4_ = uVar1;
              auVar18._44_4_ = uVar1;
              auVar18._48_4_ = uVar1;
              auVar18._52_4_ = uVar1;
              auVar18._56_4_ = uVar1;
              auVar18._60_4_ = uVar1;
              auVar51 = vfmadd231ps_avx512f(auVar51,auVar58,auVar18);
              lVar22 = lVar22 + 0x20;
              iVar40 = iVar40 + -1;
            } while (iVar40 != 0);
          }
          auVar58 = vinsertf64x4_avx512f(auVar50,auVar57._0_32_,1);
          *pauVar36 = auVar58;
          auVar58 = vinsertf64x4_avx512f(auVar56,auVar55._0_32_,1);
          pauVar36[1] = auVar58;
          auVar58 = vinsertf64x4_avx512f(auVar54,auVar53._0_32_,1);
          pauVar36[2] = auVar58;
          auVar58 = vinsertf64x4_avx512f(auVar52,auVar51._0_32_,1);
          pauVar36[3] = auVar58;
          auVar50 = vshuff64x2_avx512f(auVar50,auVar57,0xee);
          *pauVar38 = auVar50;
          auVar50 = vshuff64x2_avx512f(auVar56,auVar55,0xee);
          pauVar38[1] = auVar50;
          auVar50 = vshuff64x2_avx512f(auVar54,auVar53,0xee);
          pauVar38[2] = auVar50;
          auVar50 = vshuff64x2_avx512f(auVar52,auVar51,0xee);
          pauVar38[3] = auVar50;
          pauVar36 = pauVar36 + 4;
          pauVar38 = pauVar38 + 4;
          uVar27 = uVar33 + 8;
          lVar22 = uVar33 + 0xf;
          lVar24 = lVar24 + 1;
          uVar33 = uVar27;
        } while (lVar22 < lVar23);
      }
      uVar20 = (uint)uVar27;
      if ((int)(uVar20 | 3) < (int)uVar3) {
        uVar26 = 0;
        do {
          auVar50 = *pauVar29;
          iVar40 = (int)uVar27;
          auVar51 = auVar50;
          auVar52 = auVar50;
          auVar53 = auVar50;
          if (0 < local_94) {
            lVar24 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                     (ulong)((uVar26 & 1) + ((uint)(uVar27 >> 3) & 0x1fffffff));
            lVar22 = 0;
            iVar35 = iVar37;
            do {
              auVar54 = *(undefined1 (*) [64])
                         ((long)kernel->data +
                         lVar22 * 4 + kernel->cstep * uVar30 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar24);
              auVar55._4_4_ = uVar1;
              auVar55._0_4_ = uVar1;
              auVar55._8_4_ = uVar1;
              auVar55._12_4_ = uVar1;
              auVar55._16_4_ = uVar1;
              auVar55._20_4_ = uVar1;
              auVar55._24_4_ = uVar1;
              auVar55._28_4_ = uVar1;
              auVar55._32_4_ = uVar1;
              auVar55._36_4_ = uVar1;
              auVar55._40_4_ = uVar1;
              auVar55._44_4_ = uVar1;
              auVar55._48_4_ = uVar1;
              auVar55._52_4_ = uVar1;
              auVar55._56_4_ = uVar1;
              auVar55._60_4_ = uVar1;
              auVar52 = vfmadd231ps_avx512f(auVar52,auVar54,auVar55);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar24 + 4);
              auVar56._4_4_ = uVar1;
              auVar56._0_4_ = uVar1;
              auVar56._8_4_ = uVar1;
              auVar56._12_4_ = uVar1;
              auVar56._16_4_ = uVar1;
              auVar56._20_4_ = uVar1;
              auVar56._24_4_ = uVar1;
              auVar56._28_4_ = uVar1;
              auVar56._32_4_ = uVar1;
              auVar56._36_4_ = uVar1;
              auVar56._40_4_ = uVar1;
              auVar56._44_4_ = uVar1;
              auVar56._48_4_ = uVar1;
              auVar56._52_4_ = uVar1;
              auVar56._56_4_ = uVar1;
              auVar56._60_4_ = uVar1;
              auVar53 = vfmadd231ps_avx512f(auVar53,auVar54,auVar56);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar24 + 8);
              auVar57._4_4_ = uVar1;
              auVar57._0_4_ = uVar1;
              auVar57._8_4_ = uVar1;
              auVar57._12_4_ = uVar1;
              auVar57._16_4_ = uVar1;
              auVar57._20_4_ = uVar1;
              auVar57._24_4_ = uVar1;
              auVar57._28_4_ = uVar1;
              auVar57._32_4_ = uVar1;
              auVar57._36_4_ = uVar1;
              auVar57._40_4_ = uVar1;
              auVar57._44_4_ = uVar1;
              auVar57._48_4_ = uVar1;
              auVar57._52_4_ = uVar1;
              auVar57._56_4_ = uVar1;
              auVar57._60_4_ = uVar1;
              auVar51 = vfmadd231ps_avx512f(auVar51,auVar54,auVar57);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar24 + 0xc);
              auVar58._4_4_ = uVar1;
              auVar58._0_4_ = uVar1;
              auVar58._8_4_ = uVar1;
              auVar58._12_4_ = uVar1;
              auVar58._16_4_ = uVar1;
              auVar58._20_4_ = uVar1;
              auVar58._24_4_ = uVar1;
              auVar58._28_4_ = uVar1;
              auVar58._32_4_ = uVar1;
              auVar58._36_4_ = uVar1;
              auVar58._40_4_ = uVar1;
              auVar58._44_4_ = uVar1;
              auVar58._48_4_ = uVar1;
              auVar58._52_4_ = uVar1;
              auVar58._56_4_ = uVar1;
              auVar58._60_4_ = uVar1;
              auVar50 = vfmadd231ps_avx512f(auVar50,auVar54,auVar58);
              lVar22 = lVar22 + 0x10;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          auVar54 = vinsertf64x4_avx512f(auVar52,auVar53._0_32_,1);
          *pauVar36 = auVar54;
          auVar54 = vinsertf64x4_avx512f(auVar51,auVar50._0_32_,1);
          pauVar36[1] = auVar54;
          auVar52 = vshuff64x2_avx512f(auVar52,auVar53,0xee);
          *pauVar38 = auVar52;
          auVar50 = vshuff64x2_avx512f(auVar51,auVar50,0xee);
          pauVar38[1] = auVar50;
          pauVar36 = pauVar36 + 2;
          pauVar38 = pauVar38 + 2;
          uVar20 = iVar40 + 4;
          uVar26 = (uint)(byte)((char)uVar26 + 1);
          uVar27 = (ulong)uVar20;
        } while (iVar40 + 7 < (int)uVar3);
      }
      if ((int)uVar20 < (int)uVar3) {
        do {
          auVar50 = *pauVar29;
          if (0 < local_98) {
            pauVar21 = (undefined1 (*) [64])
                       (kernel->cstep * uVar30 * kernel->elemsize + (long)kernel->data);
            lVar24 = 0;
            do {
              auVar51 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)local_e8.data +
                                                    lVar24 * 4 +
                                                    local_e8.cstep *
                                                    CONCAT44(local_e8.elemsize._4_4_,
                                                             (undefined4)local_e8.elemsize) *
                                                    (ulong)((uVar20 & 3) + (uVar20 >> 3) +
                                                           (uint)((uVar20 >> 2 & 1) != 0)))));
              auVar50 = vfmadd231ps_avx512f(auVar50,auVar51,*pauVar21);
              pauVar21 = pauVar21 + 1;
              lVar24 = lVar24 + 1;
            } while (iVar37 != (int)lVar24);
          }
          *(undefined1 (*) [32])*pauVar36 = auVar50._0_32_;
          auVar42 = vextractf64x4_avx512f(auVar50,1);
          *(undefined1 (*) [32])*pauVar38 = auVar42;
          pauVar36 = (undefined1 (*) [64])((long)*pauVar36 + 0x20);
          pauVar38 = (undefined1 (*) [64])((long)*pauVar38 + 0x20);
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar3);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != local_80);
  }
  uVar30 = local_a0 & 0xfffffffffffffffe;
  if ((int)uVar30 != (int)local_a0) {
    iVar37 = _h * iVar4 * 0x10;
    do {
      auVar50 = local_78;
      pauVar28 = (undefined1 (*) [32])
                 (local_88->cstep * uVar30 * local_88->elemsize + (long)local_88->data);
      pauVar31 = (undefined1 (*) [32])(uVar30 * 0x20 + (long)local_90);
      if (local_90 == (void *)0x0) {
        pauVar31 = (undefined1 (*) [32])local_78;
      }
      local_78._32_32_ = auVar50._32_32_;
      local_78._0_32_ = ZEXT1632(ZEXT816(0));
      iVar40 = (int)uVar30;
      if ((int)uVar3 < 8) {
        uVar27 = 0;
      }
      else {
        uVar20 = ((uint)(uVar30 >> 0x1f) & 1) + iVar40;
        lVar24 = 0;
        uVar33 = 0;
        do {
          auVar42 = *pauVar31;
          auVar43 = auVar42;
          auVar44 = auVar42;
          auVar45 = auVar42;
          auVar46 = auVar42;
          auVar47 = auVar42;
          auVar48 = auVar42;
          auVar49 = auVar42;
          if (0 < (int)(_h * iVar4 * 0x10)) {
            lVar22 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) * lVar24;
            lVar41 = 0;
            iVar35 = iVar37;
            do {
              auVar2 = *(undefined1 (*) [32])
                        ((long)kernel->data +
                        lVar41 + kernel->cstep *
                                 (long)(int)(((int)uVar20 >> 1) + (iVar40 - (uVar20 & 0xfffffffe)))
                                 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22);
              auVar6._4_4_ = uVar1;
              auVar6._0_4_ = uVar1;
              auVar6._8_4_ = uVar1;
              auVar6._12_4_ = uVar1;
              auVar6._16_4_ = uVar1;
              auVar6._20_4_ = uVar1;
              auVar6._24_4_ = uVar1;
              auVar6._28_4_ = uVar1;
              auVar42 = vfmadd231ps_avx512vl(auVar42,auVar2,auVar6);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 4);
              auVar7._4_4_ = uVar1;
              auVar7._0_4_ = uVar1;
              auVar7._8_4_ = uVar1;
              auVar7._12_4_ = uVar1;
              auVar7._16_4_ = uVar1;
              auVar7._20_4_ = uVar1;
              auVar7._24_4_ = uVar1;
              auVar7._28_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar2,auVar7);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 8);
              auVar8._4_4_ = uVar1;
              auVar8._0_4_ = uVar1;
              auVar8._8_4_ = uVar1;
              auVar8._12_4_ = uVar1;
              auVar8._16_4_ = uVar1;
              auVar8._20_4_ = uVar1;
              auVar8._24_4_ = uVar1;
              auVar8._28_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512vl(auVar44,auVar2,auVar8);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 0xc);
              auVar9._4_4_ = uVar1;
              auVar9._0_4_ = uVar1;
              auVar9._8_4_ = uVar1;
              auVar9._12_4_ = uVar1;
              auVar9._16_4_ = uVar1;
              auVar9._20_4_ = uVar1;
              auVar9._24_4_ = uVar1;
              auVar9._28_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512vl(auVar45,auVar2,auVar9);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 0x10);
              auVar10._4_4_ = uVar1;
              auVar10._0_4_ = uVar1;
              auVar10._8_4_ = uVar1;
              auVar10._12_4_ = uVar1;
              auVar10._16_4_ = uVar1;
              auVar10._20_4_ = uVar1;
              auVar10._24_4_ = uVar1;
              auVar10._28_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar2,auVar10);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 0x14);
              auVar11._4_4_ = uVar1;
              auVar11._0_4_ = uVar1;
              auVar11._8_4_ = uVar1;
              auVar11._12_4_ = uVar1;
              auVar11._16_4_ = uVar1;
              auVar11._20_4_ = uVar1;
              auVar11._24_4_ = uVar1;
              auVar11._28_4_ = uVar1;
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar2,auVar11);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 0x18);
              auVar12._4_4_ = uVar1;
              auVar12._0_4_ = uVar1;
              auVar12._8_4_ = uVar1;
              auVar12._12_4_ = uVar1;
              auVar12._16_4_ = uVar1;
              auVar12._20_4_ = uVar1;
              auVar12._24_4_ = uVar1;
              auVar12._28_4_ = uVar1;
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar2,auVar12);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar41 + lVar22 + 0x1c);
              auVar13._4_4_ = uVar1;
              auVar13._0_4_ = uVar1;
              auVar13._8_4_ = uVar1;
              auVar13._12_4_ = uVar1;
              auVar13._16_4_ = uVar1;
              auVar13._20_4_ = uVar1;
              auVar13._24_4_ = uVar1;
              auVar13._28_4_ = uVar1;
              auVar49 = vfmadd231ps_avx512vl(auVar49,auVar2,auVar13);
              lVar41 = lVar41 + 0x20;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          *pauVar28 = auVar42;
          pauVar28[1] = auVar43;
          pauVar28[2] = auVar44;
          pauVar28[3] = auVar45;
          pauVar28[4] = auVar46;
          pauVar28[5] = auVar47;
          pauVar28[6] = auVar48;
          pauVar28[7] = auVar49;
          pauVar28 = pauVar28 + 8;
          uVar27 = uVar33 + 8;
          lVar22 = uVar33 + 0xf;
          lVar24 = lVar24 + 1;
          uVar33 = uVar27;
        } while (lVar22 < lVar23);
      }
      if ((int)((uint)uVar27 | 3) < (int)uVar3) {
        uVar20 = ((uint)(uVar30 >> 0x1f) & 1) + iVar40;
        uVar26 = 0;
        do {
          auVar42 = *pauVar31;
          iVar35 = (int)uVar27;
          auVar47 = auVar42;
          auVar45 = auVar42;
          auVar46 = auVar42;
          if (0 < (int)(_h * iVar4 * 0x10)) {
            lVar22 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                     (ulong)((uVar26 & 1) + ((uint)(uVar27 >> 3) & 0x1fffffff));
            lVar24 = 0;
            iVar39 = iVar37;
            do {
              auVar44 = *(undefined1 (*) [32])
                         ((long)kernel->data +
                         lVar24 * 2 +
                         kernel->cstep *
                         (long)(int)(((int)uVar20 >> 1) + (iVar40 - (uVar20 & 0xfffffffe))) *
                         kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar24 + lVar22);
              auVar43._4_4_ = uVar1;
              auVar43._0_4_ = uVar1;
              auVar43._8_4_ = uVar1;
              auVar43._12_4_ = uVar1;
              auVar43._16_4_ = uVar1;
              auVar43._20_4_ = uVar1;
              auVar43._24_4_ = uVar1;
              auVar43._28_4_ = uVar1;
              auVar42 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar43);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar24 + lVar22 + 4);
              auVar49._4_4_ = uVar1;
              auVar49._0_4_ = uVar1;
              auVar49._8_4_ = uVar1;
              auVar49._12_4_ = uVar1;
              auVar49._16_4_ = uVar1;
              auVar49._20_4_ = uVar1;
              auVar49._24_4_ = uVar1;
              auVar49._28_4_ = uVar1;
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar44,auVar49);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar24 + lVar22 + 8);
              auVar48._4_4_ = uVar1;
              auVar48._0_4_ = uVar1;
              auVar48._8_4_ = uVar1;
              auVar48._12_4_ = uVar1;
              auVar48._16_4_ = uVar1;
              auVar48._20_4_ = uVar1;
              auVar48._24_4_ = uVar1;
              auVar48._28_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512vl(auVar45,auVar44,auVar48);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar24 + lVar22 + 0xc);
              auVar2._4_4_ = uVar1;
              auVar2._0_4_ = uVar1;
              auVar2._8_4_ = uVar1;
              auVar2._12_4_ = uVar1;
              auVar2._16_4_ = uVar1;
              auVar2._20_4_ = uVar1;
              auVar2._24_4_ = uVar1;
              auVar2._28_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar2);
              lVar24 = lVar24 + 0x10;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          *pauVar28 = auVar42;
          pauVar28[1] = auVar47;
          pauVar28[2] = auVar45;
          pauVar28[3] = auVar46;
          pauVar28 = pauVar28 + 4;
          uVar27 = (ulong)(iVar35 + 4);
          uVar26 = (uint)(byte)((char)uVar26 + 1);
        } while (iVar35 + 7 < (int)uVar3);
      }
      else {
        uVar27 = uVar27 & 0xffffffff;
      }
      if ((int)uVar27 < (int)uVar3) {
        uVar20 = ((uint)(uVar30 >> 0x1f) & 1) + iVar40;
        do {
          uVar26 = (uint)uVar27;
          auVar42 = *pauVar31;
          auVar50 = ZEXT3264(auVar42);
          if (0 < (int)(_h * iVar4 * 0x10)) {
            pauVar25 = (undefined1 (*) [32])
                       (kernel->cstep *
                        (long)(int)(((int)uVar20 >> 1) + (iVar40 - (uVar20 & 0xfffffffe))) *
                        kernel->elemsize + (long)kernel->data);
            lVar24 = 0;
            do {
              uVar1 = *(undefined4 *)
                       ((long)local_e8.data +
                       lVar24 * 4 +
                       local_e8.cstep *
                       CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                       (ulong)((uVar26 & 3) + (int)(uVar27 >> 3) + (uint)((uVar26 >> 2 & 1) != 0)));
              auVar42._4_4_ = uVar1;
              auVar42._0_4_ = uVar1;
              auVar42._8_4_ = uVar1;
              auVar42._12_4_ = uVar1;
              auVar42._16_4_ = uVar1;
              auVar42._20_4_ = uVar1;
              auVar42._24_4_ = uVar1;
              auVar42._28_4_ = uVar1;
              auVar5 = vfmadd231ps_fma(auVar50._0_32_,auVar42,*pauVar25);
              auVar50 = ZEXT1664(auVar5);
              auVar42 = ZEXT1632(auVar5);
              pauVar25 = pauVar25 + 1;
              lVar24 = lVar24 + 1;
            } while (iVar37 != (int)lVar24);
          }
          *pauVar28 = auVar42;
          pauVar28 = pauVar28 + 1;
          uVar27 = (ulong)(uVar26 + 1);
        } while (uVar26 + 1 != uVar3);
      }
      uVar30 = uVar30 + 1;
    } while ((long)uVar30 < (long)local_a0);
  }
  piVar19 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack16to8_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 64u, 16, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 64u, 16, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 64u, 16, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 64u, 16, opt.workspace_allocator);
    {
        int nn_size = size / 8;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 16x8
                    __m512 _r0 = _mm512_loadu_ps(img0);
                    __m512 _r1 = _mm512_loadu_ps(img0 + 16);
                    __m512 _r2 = _mm512_loadu_ps(img0 + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(img0 + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(img0 + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(img0 + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(img0 + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(img0 + 16 * 7);

                    __m512 _tmp0 = _mm512_unpacklo_ps(_r0, _r1);
                    __m512 _tmp1 = _mm512_unpackhi_ps(_r0, _r1);
                    __m512 _tmp2 = _mm512_unpacklo_ps(_r2, _r3);
                    __m512 _tmp3 = _mm512_unpackhi_ps(_r2, _r3);
                    __m512 _tmp4 = _mm512_unpacklo_ps(_r4, _r5);
                    __m512 _tmp5 = _mm512_unpackhi_ps(_r4, _r5);
                    __m512 _tmp6 = _mm512_unpacklo_ps(_r6, _r7);
                    __m512 _tmp7 = _mm512_unpackhi_ps(_r6, _r7);

                    __m512 _tmp8 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp9 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpa = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpb = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpc = _mm512_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpd = _mm512_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpe = _mm512_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpf = _mm512_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));

                    _tmp0 = _mm512_shuffle_f32x4(_tmp8, _tmpc, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_f32x4(_tmp9, _tmpd, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_f32x4(_tmpa, _tmpe, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp3 = _mm512_shuffle_f32x4(_tmpb, _tmpf, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp4 = _mm512_shuffle_f32x4(_tmp8, _tmpc, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp5 = _mm512_shuffle_f32x4(_tmp9, _tmpd, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp6 = _mm512_shuffle_f32x4(_tmpa, _tmpe, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp7 = _mm512_shuffle_f32x4(_tmpb, _tmpf, _MM_SHUFFLE(3, 1, 3, 1));

                    _r0 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _r1 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _r2 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _r3 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _r4 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _r5 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                    _r6 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _r7 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_ps(tmpptr, _r0);
                    _mm512_storeu_ps(tmpptr + 16, _r1);
                    _mm512_storeu_ps(tmpptr + 16 * 2, _r2);
                    _mm512_storeu_ps(tmpptr + 16 * 3, _r3);
                    _mm512_storeu_ps(tmpptr + 16 * 4, _r4);
                    _mm512_storeu_ps(tmpptr + 16 * 5, _r5);
                    _mm512_storeu_ps(tmpptr + 16 * 6, _r6);
                    _mm512_storeu_ps(tmpptr + 16 * 7, _r7);

                    img0 += size * 16;
                    tmpptr += 128;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 16x4
                    __m512 _r0 = _mm512_loadu_ps(img0);
                    __m512 _r1 = _mm512_loadu_ps(img0 + 16);
                    __m512 _r2 = _mm512_loadu_ps(img0 + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(img0 + 16 * 3);

                    __m512 _tmp0 = _mm512_unpacklo_ps(_r0, _r1);
                    __m512 _tmp1 = _mm512_unpackhi_ps(_r0, _r1);
                    __m512 _tmp2 = _mm512_unpacklo_ps(_r2, _r3);
                    __m512 _tmp3 = _mm512_unpackhi_ps(_r2, _r3);

                    __m512 _tmp4 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp5 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmp6 = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp7 = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));

                    _tmp0 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp3 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _r0 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _r1 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _r2 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _r3 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_ps(tmpptr, _r0);
                    _mm512_storeu_ps(tmpptr + 16, _r1);
                    _mm512_storeu_ps(tmpptr + 16 * 2, _r2);
                    _mm512_storeu_ps(tmpptr + 16 * 3, _r3);

                    img0 += size * 16;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    __m512 _val = _mm512_load_ps(img0);
                    _mm512_store_ps(tmpptr, _val);

                    img0 += size * 16;
                    tmpptr += 16;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum0, 0));
            _mm256_store_ps(outptr0 + 8, _mm512_extractf32x8_ps(_sum1, 0));
            _mm256_store_ps(outptr0 + 8 * 2, _mm512_extractf32x8_ps(_sum2, 0));
            _mm256_store_ps(outptr0 + 8 * 3, _mm512_extractf32x8_ps(_sum3, 0));
            _mm256_store_ps(outptr0 + 8 * 4, _mm512_extractf32x8_ps(_sum4, 0));
            _mm256_store_ps(outptr0 + 8 * 5, _mm512_extractf32x8_ps(_sum5, 0));
            _mm256_store_ps(outptr0 + 8 * 6, _mm512_extractf32x8_ps(_sum6, 0));
            _mm256_store_ps(outptr0 + 8 * 7, _mm512_extractf32x8_ps(_sum7, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum0, 1));
            _mm256_store_ps(outptr1 + 8, _mm512_extractf32x8_ps(_sum1, 1));
            _mm256_store_ps(outptr1 + 8 * 2, _mm512_extractf32x8_ps(_sum2, 1));
            _mm256_store_ps(outptr1 + 8 * 3, _mm512_extractf32x8_ps(_sum3, 1));
            _mm256_store_ps(outptr1 + 8 * 4, _mm512_extractf32x8_ps(_sum4, 1));
            _mm256_store_ps(outptr1 + 8 * 5, _mm512_extractf32x8_ps(_sum5, 1));
            _mm256_store_ps(outptr1 + 8 * 6, _mm512_extractf32x8_ps(_sum6, 1));
            _mm256_store_ps(outptr1 + 8 * 7, _mm512_extractf32x8_ps(_sum7, 1));

            outptr0 += 64;
            outptr1 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum0, 0));
            _mm256_store_ps(outptr0 + 8, _mm512_extractf32x8_ps(_sum1, 0));
            _mm256_store_ps(outptr0 + 16, _mm512_extractf32x8_ps(_sum2, 0));
            _mm256_store_ps(outptr0 + 24, _mm512_extractf32x8_ps(_sum3, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum0, 1));
            _mm256_store_ps(outptr1 + 8, _mm512_extractf32x8_ps(_sum1, 1));
            _mm256_store_ps(outptr1 + 16, _mm512_extractf32x8_ps(_sum2, 1));
            _mm256_store_ps(outptr1 + 24, _mm512_extractf32x8_ps(_sum3, 1));

            outptr0 += 32;
            outptr1 += 32;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum, 1));

            outptr0 += 8;
            outptr1 += 8;
        }
    }

    remain_outch_start += nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum0 = _mm256_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm256_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm256_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum0 = _mm256_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);

            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum);

            outptr0 += 8;
        }
    }
}